

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

FPinfo * amrex::FabArrayBase::TheFPinfo
                   (FabArrayBase *srcfa,FabArrayBase *dstfa,IntVect *dstng,BoxConverter *coarsener,
                   Geometry *fgeom,Geometry *cgeom,IndexSpace *index_space)

{
  Long *pLVar1;
  int *piVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  bool bVar7;
  int i;
  IndexType IVar8;
  int iVar9;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  _Var10;
  FPinfo *pFVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  IndexType IVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  pVar18;
  Box local_c8;
  BoxConverter *local_a0;
  key_type local_98;
  FabArrayBase *local_88;
  FabArrayBase *local_80;
  Box *local_78;
  Geometry *local_70;
  undefined1 local_68 [16];
  FPinfo *local_58;
  Box local_4c;
  
  local_78 = &fgeom->domain;
  local_c8.smallend.vect._0_8_ = *(undefined8 *)(fgeom->domain).smallend.vect;
  uVar6 = *(undefined8 *)((fgeom->domain).smallend.vect + 2);
  local_c8._20_8_ = *(undefined8 *)((fgeom->domain).bigend.vect + 2);
  local_c8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fgeom->domain).bigend.vect >> 0x20);
  local_c8.smallend.vect[2] = (int)uVar6;
  local_c8.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
  local_a0 = coarsener;
  local_70 = cgeom;
  IVar8 = BATransformer::index_type(&(dstfa->boxarray).m_bat);
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    uVar14 = 1 << ((byte)lVar13 & 0x1f);
    uVar12 = (uint)lVar13;
    local_c8.bigend.vect[lVar13] =
         (local_c8.bigend.vect[lVar13] + (uint)((IVar8.itype >> (uVar12 & 0x1f) & 1) != 0)) -
         (uint)((local_c8.btype.itype >> (uVar12 & 0x1f) & 1) != 0);
    if ((IVar8.itype >> (uVar12 & 0x1f) & 1) == 0) {
      IVar15.itype = ~uVar14 & local_c8.btype.itype;
    }
    else {
      IVar15.itype = uVar14 | local_c8.btype.itype;
    }
    local_c8.btype.itype = IVar15.itype;
  }
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    if (*(char *)((long)(fgeom->super_CoordSys).inv_dx + lVar13 + 0x19) == '\x01') {
      iVar9 = dstng->vect[lVar13];
      piVar2 = local_c8.smallend.vect + lVar13;
      *piVar2 = *piVar2 - iVar9;
      piVar2 = local_c8.bigend.vect + lVar13;
      *piVar2 = *piVar2 + iVar9;
    }
  }
  peVar3 = (srcfa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar4 = (srcfa->distributionMap).m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.m_ba_id.data =
       (dstfa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.m_dm_id.data =
       (dstfa->distributionMap).m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88 = srcfa;
  local_80 = dstfa;
  pVar18 = std::
           _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
           ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                          *)m_TheFillPatchCache,&local_98);
  _Var10 = pVar18.first._M_node;
  do {
    if (_Var10._M_node == (_Base_ptr)pVar18.second._M_node) {
      pFVar11 = (FPinfo *)operator_new(0x148);
      FPinfo::FPinfo(pFVar11,local_88,local_80,&local_c8,dstng,local_a0,local_78,&local_70->domain,
                     index_space);
      pFVar11->m_nuse = 1;
      CacheStats::recordBuild((CacheStats *)m_FPinfo_stats);
      m_FPinfo_stats._16_8_ = m_FPinfo_stats._16_8_ + 1;
      local_68._0_8_ = local_98.m_ba_id.data;
      local_68._8_8_ = local_98.m_dm_id.data;
      local_58 = pFVar11;
      std::
      _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
      ::_M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>
                ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
                  *)m_TheFillPatchCache,(_Base_ptr)pVar18.second._M_node,
                 (pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*> *)local_68);
      if ((peVar3 != local_98.m_ba_id.data) || (peVar4 != local_98.m_dm_id.data)) {
        local_68._0_8_ = peVar3;
        local_68._8_8_ = peVar4;
        local_58 = pFVar11;
        std::
        _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
        ::_M_insert_equal<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>
                  ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
                    *)m_TheFillPatchCache,
                   (pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*> *)local_68
                  );
      }
      return pFVar11;
    }
    p_Var5 = _Var10._M_node[1]._M_left;
    if (((element_type *)p_Var5[7]._M_left == peVar3) &&
       ((element_type *)p_Var5[7]._M_right == peVar4)) {
      auVar16._0_4_ = -(uint)(p_Var5[8]._M_color == (_Rb_tree_color)local_98.m_ba_id.data);
      auVar16._4_4_ = -(uint)(*(int *)&p_Var5[8].field_0x4 == local_98.m_ba_id.data._4_4_);
      auVar16._8_4_ = -(uint)(*(int *)&p_Var5[8]._M_parent == (int)local_98.m_dm_id.data);
      auVar16._12_4_ =
           -(uint)(*(int *)((long)&p_Var5[8]._M_parent + 4) == local_98.m_dm_id.data._4_4_);
      auVar17._4_4_ = auVar16._0_4_;
      auVar17._0_4_ = auVar16._4_4_;
      auVar17._8_4_ = auVar16._12_4_;
      auVar17._12_4_ = auVar16._8_4_;
      iVar9 = movmskpd((int)_Var10._M_node,auVar17 & auVar16);
      if (((iVar9 == 3) &&
          (((bVar7 = Box::operator==((Box *)&p_Var5[8]._M_left,&local_c8), bVar7 &&
            (p_Var5 = _Var10._M_node[1]._M_left,
            *(int *)((long)&p_Var5[9]._M_parent + 4) == dstng->vect[0])) &&
           (*(int *)&p_Var5[9]._M_left == dstng->vect[1])))) &&
         ((*(int *)((long)&p_Var5[9]._M_left + 4) == dstng->vect[2] &&
          (local_c8.btype.itype == *(uint *)&p_Var5[9]._M_parent)))) {
        (*(code *)**(undefined8 **)p_Var5[9]._M_right)
                  (local_68,p_Var5[9]._M_right,&p_Var5[8]._M_left);
        (**local_a0->_vptr_BoxConverter)(&local_4c,local_a0,&local_c8);
        bVar7 = Box::operator==((Box *)local_68,&local_4c);
        if (bVar7) {
          pFVar11 = (FPinfo *)_Var10._M_node[1]._M_left;
          pLVar1 = &pFVar11->m_nuse;
          *pLVar1 = *pLVar1 + 1;
          m_FPinfo_stats._16_8_ = m_FPinfo_stats._16_8_ + 1;
          return pFVar11;
        }
      }
    }
    _Var10._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var10._M_node);
  } while( true );
}

Assistant:

const FabArrayBase::FPinfo&
FabArrayBase::TheFPinfo (const FabArrayBase& srcfa,
                         const FabArrayBase& dstfa,
                         const IntVect&      dstng,
                         const BoxConverter& coarsener,
                         const Geometry&     fgeom,
                         const Geometry&     cgeom,
                         const EB2::IndexSpace* index_space)
{
    BL_PROFILE("FabArrayBase::TheFPinfo()");

    Box dstdomain = fgeom.Domain();
    dstdomain.convert(dstfa.boxArray().ixType());
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (fgeom.isPeriodic(i)) {
            dstdomain.grow(i,dstng[i]);
        }
    }

    const BDKey& srckey = srcfa.getBDKey();
    const BDKey& dstkey = dstfa.getBDKey();

    std::pair<FPinfoCacheIter,FPinfoCacheIter> er_it = m_TheFillPatchCache.equal_range(dstkey);

    for (FPinfoCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_srcbdk    == srckey    &&
            it->second->m_dstbdk    == dstkey    &&
            it->second->m_dstdomain == dstdomain &&
            it->second->m_dstng     == dstng     &&
            it->second->m_dstdomain.ixType() == dstdomain.ixType() &&
            it->second->m_coarsener->doit(it->second->m_dstdomain) == coarsener.doit(dstdomain))
        {
            ++(it->second->m_nuse);
            m_FPinfo_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    FPinfo* new_fpc = new FPinfo(srcfa, dstfa, dstdomain, dstng, coarsener,
                                 fgeom.Domain(), cgeom.Domain(), index_space);

#ifdef AMREX_MEM_PROFILING
    m_FPinfo_stats.bytes += new_fpc->bytes();
    m_FPinfo_stats.bytes_hwm = std::max(m_FPinfo_stats.bytes_hwm, m_FPinfo_stats.bytes);
#endif

    new_fpc->m_nuse = 1;
    m_FPinfo_stats.recordBuild();
    m_FPinfo_stats.recordUse();

    m_TheFillPatchCache.insert(er_it.second, FPinfoCache::value_type(dstkey,new_fpc));
    if (srckey != dstkey)
        m_TheFillPatchCache.insert(          FPinfoCache::value_type(srckey,new_fpc));

    return *new_fpc;
}